

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_s2c_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,
              secp256k1_ecdsa_s2c_opening *s2c_opening,uchar *msg32,uchar *seckey,uchar *s2c_data32)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar ndata [32];
  secp256k1_scalar local_d8;
  secp256k1_scalar local_b8;
  secp256k1_sha256 local_98;
  
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_ecdsa_s2c_sign_cold_5();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_ecdsa_s2c_sign_cold_4();
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_s2c_sign_cold_3();
  }
  else if (seckey == (uchar *)0x0) {
    secp256k1_ecdsa_s2c_sign_cold_2();
  }
  else {
    if (s2c_data32 != (uchar *)0x0) {
      local_98.s[0] = 0xfeefd675;
      local_98.s[1] = 0x73166c99;
      local_98.s[2] = 0xe2309cb8;
      local_98.s[3] = 0x6d458113;
      local_98.s[4] = 0x1d3a512;
      local_98.s[5] = 0xe18112;
      local_98.s[6] = 0x37ee0874;
      local_98.s[7] = 0x421fc55f;
      local_98.bytes = 0x40;
      secp256k1_sha256_write(&local_98,s2c_data32,0x20);
      secp256k1_sha256_finalize(&local_98,ndata);
      local_98.s[0] = 0xa9b21c7b;
      local_98.s[1] = 0x358c3e3e;
      local_98.s[2] = 0xb6863d1;
      local_98.s[3] = 0xc62b2035;
      local_98.s[4] = 0xb44b40ce;
      local_98.s[5] = 0x254a8912;
      local_98.s[6] = 0xf85d0d4;
      local_98.s[7] = 0x8a5bf91c;
      local_98.bytes = 0x40;
      iVar1 = secp256k1_ecdsa_sign_inner
                        (ctx,&local_b8,&local_d8,(int *)0x0,&local_98,s2c_opening,s2c_data32,msg32,
                         seckey,(secp256k1_nonce_function)0x0,ndata);
      uVar5 = (uint)(iVar1 == 0);
      uVar2 = (int)(uVar5 << 0x1f) >> 0x1f;
      uVar3 = (int)(uVar5 << 0x1f) >> 0x1f;
      uVar4 = (int)(uVar5 << 0x1f) >> 0x1f;
      uVar5 = (int)(uVar5 << 0x1f) >> 0x1f;
      *(ulong *)(signature->data + 0x10) =
           CONCAT44(~uVar3 & local_b8.d[2]._4_4_,~uVar2 & (uint)local_b8.d[2]);
      *(ulong *)(signature->data + 0x18) =
           CONCAT44(~uVar5 & local_b8.d[3]._4_4_,~uVar4 & (uint)local_b8.d[3]);
      *(ulong *)signature->data =
           CONCAT44(~uVar3 & local_b8.d[0]._4_4_,~uVar2 & (uint)local_b8.d[0]);
      *(ulong *)(signature->data + 8) =
           CONCAT44(~uVar5 & local_b8.d[1]._4_4_,~uVar4 & (uint)local_b8.d[1]);
      *(ulong *)(signature->data + 0x30) =
           CONCAT44(~uVar3 & local_d8.d[2]._4_4_,~uVar2 & (uint)local_d8.d[2]);
      *(ulong *)(signature->data + 0x38) =
           CONCAT44(~uVar5 & local_d8.d[3]._4_4_,~uVar4 & (uint)local_d8.d[3]);
      *(ulong *)(signature->data + 0x20) =
           CONCAT44(~uVar3 & local_d8.d[0]._4_4_,~uVar2 & (uint)local_d8.d[0]);
      *(ulong *)(signature->data + 0x28) =
           CONCAT44(~uVar5 & local_d8.d[1]._4_4_,~uVar4 & (uint)local_d8.d[1]);
      return iVar1;
    }
    secp256k1_ecdsa_s2c_sign_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_s2c_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature* signature, secp256k1_ecdsa_s2c_opening* s2c_opening, const unsigned char
 *msg32, const unsigned char *seckey, const unsigned char* s2c_data32) {
    secp256k1_scalar r, s;
    int ret;
    unsigned char ndata[32];
    secp256k1_sha256 s2c_sha;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(s2c_data32 != NULL);

    /* Provide `s2c_data32` to the nonce function as additional data to
     * derive the nonce. It is first hashed because it should be possible
     * to derive nonces even if only a SHA256 commitment to the data is
     * known.  This is important in the ECDSA anti-exfil protocol. */
    secp256k1_s2c_ecdsa_data_sha256_tagged(&s2c_sha);
    secp256k1_sha256_write(&s2c_sha, s2c_data32, 32);
    secp256k1_sha256_finalize(&s2c_sha, ndata);

    secp256k1_s2c_ecdsa_point_sha256_tagged(&s2c_sha);
    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, &s2c_sha, s2c_opening, s2c_data32, msg32, seckey, NULL, ndata);
    secp256k1_scalar_cmov(&r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_zero, !ret);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}